

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  byte bVar1;
  uint ttf_size;
  uint uVar2;
  uchar *ttf_data;
  ImFont *pIVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lStack_d0;
  ImFontConfig font_cfg;
  
  ttf_size = stb_decompress_length((uchar *)compressed_ttf_data);
  ttf_data = (uchar *)ImGui::MemAlloc((ulong)ttf_size);
  iVar5 = swap_bytes(*compressed_ttf_data);
  if ((iVar5 == 0x57bc0000) &&
     (iVar5 = swap_bytes(*(undefined4 *)((long)compressed_ttf_data + 4)), iVar5 == 0)) {
    uVar2 = stb_decompress_length((uchar *)compressed_ttf_data);
    pbVar8 = (byte *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e = ttf_data + uVar2;
    stb__barrier_out_b = ttf_data;
    stb__dout = ttf_data;
    do {
      bVar1 = *pbVar8;
      uVar7 = (uint)bVar1;
      if (bVar1 < 0x20) {
        if (bVar1 < 0x18) {
          if (bVar1 < 0x10) {
            if (bVar1 < 8) {
              if (bVar1 == 4) {
                uVar4 = swap_bytes(*(undefined2 *)(pbVar8 + 4));
                stb__match(stb__dout +
                           ~((ulong)pbVar8[3] | (ulong)pbVar8[1] << 0x10 | (ulong)pbVar8[2] << 8),
                           uVar4 + 1);
                pbVar9 = pbVar8 + 6;
                goto LAB_00203381;
              }
              if (uVar7 == 6) {
                uVar7 = (uint)pbVar8[4];
                uVar6 = ~((ulong)pbVar8[3] | (ulong)pbVar8[1] << 0x10 | (ulong)pbVar8[2] << 8);
                goto LAB_00203301;
              }
              if (uVar7 != 7) break;
              uVar4 = swap_bytes(*(undefined2 *)(pbVar8 + 1));
              stb__lit(pbVar8 + 3,uVar4 + 1);
              uVar4 = swap_bytes(*(undefined2 *)(pbVar8 + 1));
              uVar6 = (ulong)uVar4;
              lStack_d0 = 4;
            }
            else {
              stb__lit(pbVar8 + 2,(uint)bVar1 * 0x100 + -0x7ff + (uint)pbVar8[1]);
              uVar4 = swap_bytes(*(undefined2 *)pbVar8);
              lStack_d0 = -0x7fd;
              uVar6 = (ulong)uVar4;
            }
LAB_0020336f:
            pbVar9 = pbVar8 + uVar6 + lStack_d0;
            if (pbVar9 == pbVar8) break;
          }
          else {
            uVar4 = swap_bytes(*(undefined2 *)(pbVar8 + 3));
            uVar6 = -(ulong)((uint)pbVar8[1] * 0x100 + -0xfffff +
                            ((uint)pbVar8[2] | (uint)bVar1 << 0x10));
            uVar7 = (uint)uVar4;
LAB_00203301:
            stb__match(stb__dout + uVar6,uVar7 + 1);
            pbVar9 = pbVar8 + 5;
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)((uint)pbVar8[1] * 0x100 + -0x17ffff +
                             ((uint)pbVar8[2] | (uint)bVar1 << 0x10)),pbVar8[3] + 1);
          pbVar9 = pbVar8 + 4;
        }
      }
      else if ((char)bVar1 < '\0') {
        stb__match(stb__dout + ~(ulong)pbVar8[1],uVar7 - 0x7f);
        pbVar9 = pbVar8 + 2;
      }
      else {
        if (bVar1 < 0x40) {
          stb__lit(pbVar8 + 1,uVar7 - 0x1f);
          uVar6 = (ulong)*pbVar8;
          lStack_d0 = -0x1e;
          goto LAB_0020336f;
        }
        stb__match(stb__dout + -(ulong)((uint)bVar1 * 0x100 + -0x3fff + (uint)pbVar8[1]),
                   pbVar8[2] + 1);
        pbVar9 = pbVar8 + 3;
      }
LAB_00203381:
      pbVar8 = pbVar9;
    } while (stb__dout <= ttf_data + uVar2);
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    ImFontConfig::ImFontConfig(&font_cfg);
  }
  else {
    font_cfg.DstFont = font_cfg_template->DstFont;
    font_cfg.FontData = font_cfg_template->FontData;
    font_cfg.FontDataSize = font_cfg_template->FontDataSize;
    font_cfg.FontDataOwnedByAtlas = font_cfg_template->FontDataOwnedByAtlas;
    font_cfg._13_3_ = *(undefined3 *)&font_cfg_template->field_0xd;
    font_cfg.FontNo = font_cfg_template->FontNo;
    font_cfg.SizePixels = font_cfg_template->SizePixels;
    font_cfg.OversampleH = font_cfg_template->OversampleH;
    font_cfg.OversampleV = font_cfg_template->OversampleV;
    font_cfg.PixelSnapH = font_cfg_template->PixelSnapH;
    font_cfg._33_3_ = *(undefined3 *)&font_cfg_template->field_0x21;
    font_cfg.GlyphExtraSpacing.x = (font_cfg_template->GlyphExtraSpacing).x;
    font_cfg._40_8_ = *(undefined8 *)&(font_cfg_template->GlyphExtraSpacing).y;
    font_cfg._48_8_ = *(undefined8 *)&(font_cfg_template->GlyphOffset).y;
    font_cfg.GlyphRanges = font_cfg_template->GlyphRanges;
    font_cfg.GlyphMinAdvanceX = font_cfg_template->GlyphMinAdvanceX;
    font_cfg.GlyphMaxAdvanceX = font_cfg_template->GlyphMaxAdvanceX;
    font_cfg.MergeMode = font_cfg_template->MergeMode;
    font_cfg._73_3_ = *(undefined3 *)&font_cfg_template->field_0x49;
    font_cfg.RasterizerFlags = font_cfg_template->RasterizerFlags;
    font_cfg.RasterizerMultiply = font_cfg_template->RasterizerMultiply;
    font_cfg.EllipsisChar = font_cfg_template->EllipsisChar;
    font_cfg.Name[0] = font_cfg_template->Name[0];
    font_cfg.Name[1] = font_cfg_template->Name[1];
    font_cfg.Name._2_8_ = *(undefined8 *)(font_cfg_template->Name + 2);
    font_cfg.Name._10_8_ = *(undefined8 *)(font_cfg_template->Name + 10);
    font_cfg.Name._18_8_ = *(undefined8 *)(font_cfg_template->Name + 0x12);
    font_cfg.Name._26_8_ = *(undefined8 *)(font_cfg_template->Name + 0x1a);
    font_cfg._120_8_ = *(undefined8 *)(font_cfg_template->Name + 0x22);
  }
  font_cfg.FontDataOwnedByAtlas = true;
  pIVar3 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&font_cfg,glyph_ranges);
  return pIVar3;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}